

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,3,2>,tcu::Vector<float,2>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  _Rb_tree_node_base *p_Var1;
  pointer pVVar2;
  pointer pVVar3;
  Variable<tcu::Vector<float,_3>_> *pVVar4;
  pointer pcVar5;
  Variable<tcu::Matrix<float,_3,_2>_> *pVVar6;
  Variable<tcu::Vector<float,_2>_> *pVVar7;
  byte bVar8;
  undefined8 uVar9;
  Context *pCVar10;
  ulong uVar11;
  FloatFormat *fmt;
  pointer pMVar12;
  bool bVar13;
  bool bVar14;
  ContextType type;
  int iVar15;
  uint uVar16;
  _Rb_tree_node_base *p_Var17;
  char *__s;
  size_t sVar18;
  long *plVar19;
  ShaderExecutor *pSVar20;
  long lVar21;
  IVal *pIVar22;
  IVal *pIVar23;
  IVal *pIVar24;
  TestError *this_00;
  TestLog *pTVar25;
  Vector<float,_3> *val;
  undefined8 *puVar26;
  byte bVar27;
  PrecisionCase *pPVar28;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
  *pVVar29;
  byte bVar30;
  IVal in2;
  FuncSet funcs;
  IVal in3;
  IVal in1;
  ostringstream os;
  FloatFormat highpFmt;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
  outputs;
  ShaderSpec spec;
  ostringstream oss;
  undefined1 auStack_548 [8];
  PrecisionCase *local_540;
  undefined1 local_538 [12];
  undefined4 uStack_52c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
  *local_518;
  ulong local_510;
  undefined1 local_508 [12];
  uint uStack_4fc;
  undefined1 auStack_4f8 [24];
  double dStack_4e0;
  double local_4c0;
  Statement *local_4b8;
  string local_4b0;
  double local_490;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_488;
  ResultCollector *local_480;
  undefined1 local_478 [32];
  double local_458;
  double dStack_450;
  undefined1 local_448 [8];
  undefined1 auStack_440 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  double local_428;
  Data DStack_420;
  undefined4 local_410;
  undefined8 auStack_400 [5];
  ios_base local_3d8 [8];
  ios_base local_3d0 [264];
  FloatFormat local_2c8;
  ulong local_2a0;
  FloatFormat *local_298;
  long local_290;
  long local_288;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_280;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
  local_250;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [72];
  undefined1 local_160 [304];
  
  bVar30 = 0;
  pVVar2 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_4c0 = (double)(((long)pVVar3 - (long)pVVar2 >> 2) * -0x5555555555555555);
  local_518 = variables;
  local_4b8 = stmt;
  local_488 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
  ::Outputs(&local_250,(size_t)local_4c0);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_2c8.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_2c8.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_2c8.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_2c8.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_2c8.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_2c8.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_2c8.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_2c8.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_2c8._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_280._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_280._M_impl.super__Rb_tree_header._M_header;
  local_280._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_280._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_280._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_448 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_540 = this;
  local_280._M_impl.super__Rb_tree_header._M_header._M_right =
       local_280._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_440);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_440,"Statement: ",0xb);
  (*local_4b8->_vptr_Statement[2])(local_4b8,(ostringstream *)auStack_440);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_440);
  std::ios_base::~ios_base(local_3d0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var1 = (_Rb_tree_node_base *)(local_508 + 8);
  stack0xfffffffffffffb00 = (double)((ulong)uStack_4fc << 0x20);
  auStack_4f8._0_8_ = (_Base_ptr)0x0;
  dStack_4e0 = 0.0;
  auStack_4f8._8_8_ = p_Var1;
  auStack_4f8._16_8_ = p_Var1;
  (*local_4b8->_vptr_Statement[4])(local_4b8,local_508);
  if ((_Rb_tree_node_base *)auStack_4f8._8_8_ != p_Var1) {
    p_Var17 = (_Rb_tree_node_base *)auStack_4f8._8_8_;
    do {
      (**(code **)(**(long **)(p_Var17 + 1) + 0x30))(*(long **)(p_Var17 + 1),local_1a8);
      p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
    } while (p_Var17 != p_Var1);
  }
  if (dStack_4e0 != 0.0) {
    local_448 = (undefined1  [8])((local_540->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_440);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_440,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_440,(char *)local_478._0_8_,local_478._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
      operator_delete((void *)local_478._0_8_,(ulong)(local_478._16_8_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_440);
    std::ios_base::~ios_base(local_3d0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_508);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_160 + 0x28));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_448);
  pPVar28 = local_540;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448,"precision ",10);
  __s = glu::getPrecisionName((pPVar28->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_548 + (long)((TestLog *)((long)local_448 + -0x18))->m_log) + 0x100
                   );
  }
  else {
    sVar18 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448,__s,sVar18);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar5 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar5) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_448);
  std::ios_base::~ios_base(local_3d8);
  pPVar28 = local_540;
  type.super_ApiType.m_bits =
       (ApiType)(*((local_540->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((pPVar28->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&pPVar28->m_extension);
    plVar19 = (long *)std::__cxx11::string::append(local_1a8);
    pTVar25 = (TestLog *)(plVar19 + 2);
    if ((TestLog *)*plVar19 == pTVar25) {
      local_438._M_allocated_capacity = (size_type)pTVar25->m_log;
      local_438._8_8_ = plVar19[3];
      local_448 = (undefined1  [8])(auStack_440 + 8);
    }
    else {
      local_438._M_allocated_capacity = (size_type)pTVar25->m_log;
      local_448 = (undefined1  [8])*plVar19;
    }
    auStack_440 = (undefined1  [8])plVar19[1];
    *plVar19 = (long)pTVar25;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_448);
    if (local_448 != (undefined1  [8])(auStack_440 + 8)) {
      operator_delete((void *)local_448,(ulong)(local_438._M_allocated_capacity + 1));
    }
    pPVar28 = local_540;
    if ((pointer)local_1a8._0_8_ != pcVar5) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),1);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_448,pPVar28,
             (local_518->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar9 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_448);
  glu::VarType::operator=((VarType *)(uVar9 + 0x20),(VarType *)&local_428);
  glu::VarType::~VarType((VarType *)&local_428);
  if (local_448 != (undefined1  [8])(auStack_440 + 8)) {
    operator_delete((void *)local_448,(ulong)(local_438._M_allocated_capacity + 1));
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),2);
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_448,local_540,
             (local_518->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar9 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)(local_220._32_8_ + 0x38),(string *)local_448);
  glu::VarType::operator=(&((pointer)(uVar9 + 0x38))->varType,(VarType *)&local_428);
  glu::VarType::~VarType((VarType *)&local_428);
  pPVar28 = local_540;
  if (local_448 != (undefined1  [8])(auStack_440 + 8)) {
    operator_delete((void *)local_448,(ulong)(local_438._M_allocated_capacity + 1));
  }
  makeSymbol<tcu::Matrix<float,3,2>>
            ((Symbol *)local_448,pPVar28,
             (local_518->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr);
  uVar9 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_448);
  glu::VarType::operator=((VarType *)(uVar9 + 0x20),(VarType *)&local_428);
  glu::VarType::~VarType((VarType *)&local_428);
  if (local_448 != (undefined1  [8])(auStack_440 + 8)) {
    operator_delete((void *)local_448,(ulong)(local_438._M_allocated_capacity + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_448);
  (*local_4b8->_vptr_Statement[2])(local_4b8,local_448);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_448);
  std::ios_base::~ios_base(local_3d8);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar5) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar28 = local_540;
  pSVar20 = ShaderExecUtil::createExecutor
                      ((local_540->m_ctx).renderContext,(local_540->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  local_448 = (undefined1  [8])
              (local_488->in0).
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  auStack_440 = (undefined1  [8])
                (local_488->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_438._M_allocated_capacity =
       (size_type)
       (local_488->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_438._8_8_ =
       (local_488->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_250.out0.
       super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_250.out1.
       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*pSVar20->_vptr_ShaderExecutor[3])
            (pSVar20,((pPVar28->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar15 = (*pSVar20->_vptr_ShaderExecutor[2])(pSVar20);
  if ((char)iVar15 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar20->_vptr_ShaderExecutor[5])(pSVar20);
  (*pSVar20->_vptr_ShaderExecutor[6])(pSVar20,local_4c0,local_448,local_1a8);
  pCVar10 = &local_540->m_ctx;
  (*pSVar20->_vptr_ShaderExecutor[1])(pSVar20);
  lVar21 = 8;
  do {
    local_1a8[lVar21 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar21) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar21 + 8) = 0xfff0000000000000;
    lVar21 = lVar21 + 0x18;
  } while (lVar21 != 0x50);
  lVar21 = 8;
  do {
    local_1a8[lVar21 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar21) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar21 + 8) = 0xfff0000000000000;
    lVar21 = lVar21 + 0x18;
  } while (lVar21 != 0x50);
  local_298 = &pCVar10->floatFormat;
  tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_448);
  pVVar29 = local_518;
  pPVar28 = local_540;
  local_508._0_8_ = local_508._0_8_ & 0xffffffffffffff00;
  stack0xfffffffffffffb00 = INFINITY;
  auStack_4f8._0_8_ = (_Base_ptr)0xfff0000000000000;
  auStack_4f8._8_8_ = auStack_4f8._8_8_ & 0xffffffffffffff00;
  auStack_4f8._16_8_ = (_Base_ptr)0x7ff0000000000000;
  dStack_4e0 = -INFINITY;
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_280,
             (local_518->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_280,
             (pVVar29->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_478);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_280,
             (pVVar29->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_538);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_280,
             (pVVar29->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_4b0);
  Environment::bind<tcu::Matrix<float,3,2>>
            ((Environment *)&local_280,
             (pVVar29->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr,(IVal *)local_448);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_280,
             (pVVar29->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_508);
  if (pVVar3 == pVVar2) {
LAB_017883d2:
    local_448 = (undefined1  [8])((pPVar28->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_440);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_440,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_440);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_440," inputs passed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_480 = &pPVar28->m_status;
    local_2a0 = (long)local_4c0 + (ulong)(local_4c0 == 0.0);
    local_510 = 0;
    local_490 = 0.0;
    pVVar29 = local_518;
    do {
      tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_1a8);
      local_478._0_8_ = local_478._0_8_ & 0xffffffffffffff00;
      local_478._8_8_ = INFINITY;
      local_478._16_8_ = -INFINITY;
      local_478._24_8_ = local_478._24_8_ & 0xffffffffffffff00;
      local_458 = INFINITY;
      dStack_450 = -INFINITY;
      if ((local_510 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((pPVar28->super_TestCase).super_TestNode.m_testCtx);
      }
      fmt = local_298;
      uVar11 = local_510;
      pVVar2 = (local_488->in0).
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_538._8_4_ = pVVar2[local_510].m_data[2];
      local_538._0_8_ = *(undefined8 *)pVVar2[local_510].m_data;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_508,local_298,(Vector<float,_3> *)local_538);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_448,fmt,(IVal *)local_508);
      pIVar22 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_280,
                           (pVVar29->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      puVar26 = (undefined8 *)local_448;
      for (lVar21 = 9; lVar21 != 0; lVar21 = lVar21 + -1) {
        *(undefined8 *)pIVar22->m_data = *puVar26;
        puVar26 = puVar26 + (ulong)bVar30 * -2 + 1;
        pIVar22 = (IVal *)((long)pIVar22 + ((ulong)bVar30 * -2 + 1) * 8);
      }
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_280,
                 (pVVar29->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_280,
                 (pVVar29->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_280,
                 (pVVar29->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      DStack_420.basic.type = (pPVar28->m_ctx).precision;
      local_428 = fmt->m_maxValue;
      local_448 = *(undefined1 (*) [8])fmt;
      auStack_440 = *(undefined1 (*) [8])&fmt->m_fractionBits;
      local_438._M_allocated_capacity = *(undefined8 *)&fmt->m_hasInf;
      local_438._8_8_ = *(undefined8 *)&fmt->m_exactPrecision;
      local_410 = 0;
      DStack_420._8_8_ = &local_280;
      (*local_4b8->_vptr_Statement[3])(local_4b8,(IVal *)local_448);
      pIVar23 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_280,
                           (pVVar29->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_448,&local_2c8,pIVar23);
      dStack_450 = (double)CONCAT44(DStack_420.basic.precision,DStack_420.basic.type);
      local_458 = local_428;
      local_478._16_8_ = local_438._M_allocated_capacity;
      local_478._24_8_ = local_438._8_8_;
      local_478._0_8_ = local_448;
      local_478._8_8_ = auStack_440;
      local_288 = local_510 * 8;
      bVar13 = contains<tcu::Vector<float,2>>
                         ((IVal *)local_478,
                          local_250.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_510);
      local_448 = (undefined1  [8])(auStack_440 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_448,"Shader output 1 is outside acceptable range","");
      bVar13 = tcu::ResultCollector::check(local_480,bVar13,(string *)local_448);
      if (local_448 != (undefined1  [8])(auStack_440 + 8)) {
        operator_delete((void *)local_448,(ulong)(local_438._M_allocated_capacity + 1));
      }
      pIVar24 = Environment::lookup<tcu::Matrix<float,3,2>>
                          ((Environment *)&local_280,
                           (pVVar29->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doConvert
                ((IVal *)local_448,&local_2c8,pIVar24);
      pMVar12 = local_250.out0.
                super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar21 = 0;
      do {
        *(undefined8 *)(local_1a8 + lVar21 + 0x10) = *(undefined8 *)(auStack_440 + lVar21 + 8);
        *(undefined8 *)(local_1a8 + lVar21) = *(undefined8 *)(local_448 + lVar21);
        *(undefined8 *)(local_1a8 + lVar21 + 8) = *(undefined8 *)(auStack_440 + lVar21);
        uVar9 = *(undefined8 *)((long)auStack_400 + lVar21 + 8);
        *(undefined8 *)(local_160 + lVar21) = *(undefined8 *)((long)auStack_400 + lVar21);
        *(undefined8 *)(local_160 + lVar21 + 8) = uVar9;
        *(undefined8 *)(local_160 + lVar21 + 0x10) =
             *(undefined8 *)((long)auStack_400 + lVar21 + 0x10);
        lVar21 = lVar21 + 0x18;
      } while (lVar21 != 0x48);
      local_290 = uVar11 * 0x18;
      bVar27 = 1;
      lVar21 = 0;
      pIVar22 = (IVal *)local_1a8;
      do {
        bVar14 = ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
                           (pIVar22,pMVar12[uVar11].m_data.m_data + lVar21);
        lVar21 = 1;
        bVar8 = bVar27 & bVar14;
        bVar27 = 0;
        pIVar22 = (IVal *)local_160;
      } while (bVar8 != 0);
      local_448 = (undefined1  [8])(auStack_440 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_448,"Shader output 0 is outside acceptable range","");
      bVar14 = tcu::ResultCollector::check(local_480,bVar14,(string *)local_448);
      pVVar29 = local_518;
      pPVar28 = local_540;
      if (local_448 != (undefined1  [8])(auStack_440 + 8)) {
        operator_delete((void *)local_448,(ulong)(local_438._M_allocated_capacity + 1));
      }
      if ((!bVar13 || !bVar14) &&
         (uVar16 = SUB84(local_490,0) + 1, local_490 = (double)(ulong)uVar16, (int)uVar16 < 0x65)) {
        local_448 = (undefined1  [8])((pPVar28->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_440);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_440,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_440," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_440,"\t",1);
        pVVar4 = (pVVar29->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                 .m_ptr;
        val = (Vector<float,_3> *)auStack_4f8;
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        local_508._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_508,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_440,(char *)local_508._0_8_,(long)stack0xfffffffffffffb00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_440," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)local_538,(BuiltinPrecisionTests *)&local_2c8,
                   (FloatFormat *)
                   ((local_488->in0).
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar11),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_440,(char *)local_538._0_8_,
                   CONCAT44(uStack_52c,local_538._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_440,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._0_8_ != &local_528) {
          operator_delete((void *)local_538._0_8_,local_528._M_allocated_capacity + 1);
        }
        if ((Vector<float,_3> *)local_508._0_8_ != (Vector<float,_3> *)auStack_4f8) {
          operator_delete((void *)local_508._0_8_,
                          (ulong)((long)(_Rb_tree_color *)auStack_4f8._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_440,"\t",1);
        pVVar6 = (pVVar29->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                 .m_ptr;
        pIVar24 = (IVal *)auStack_4f8;
        pcVar5 = (pVVar6->m_name)._M_dataplus._M_p;
        local_508._0_8_ = pIVar24;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_508,pcVar5,pcVar5 + (pVVar6->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_440,(char *)local_508._0_8_,(long)stack0xfffffffffffffb00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_440," = ",3);
        valueToString<tcu::Matrix<float,3,2>>
                  ((string *)local_538,(BuiltinPrecisionTests *)&local_2c8,
                   (FloatFormat *)
                   ((long)((local_250.out0.
                            super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   local_290),(Matrix<float,_3,_2> *)pIVar24);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_440,(char *)local_538._0_8_,
                   CONCAT44(uStack_52c,local_538._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_440,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_440,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,3,2>>
                  (&local_4b0,(BuiltinPrecisionTests *)&local_2c8,(FloatFormat *)local_1a8,pIVar24);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_440,local_4b0._M_dataplus._M_p,local_4b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_440,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
          operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._0_8_ != &local_528) {
          operator_delete((void *)local_538._0_8_,local_528._M_allocated_capacity + 1);
        }
        if ((IVal *)local_508._0_8_ != (IVal *)auStack_4f8) {
          operator_delete((void *)local_508._0_8_,
                          (ulong)((long)(_Rb_tree_color *)auStack_4f8._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_440,"\t",1);
        pVVar7 = (pVVar29->out1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                 .m_ptr;
        pIVar23 = (IVal *)auStack_4f8;
        pcVar5 = (pVVar7->m_name)._M_dataplus._M_p;
        local_508._0_8_ = pIVar23;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_508,pcVar5,pcVar5 + (pVVar7->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_440,(char *)local_508._0_8_,(long)stack0xfffffffffffffb00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_440," = ",3);
        valueToString<tcu::Vector<float,2>>
                  ((string *)local_538,(BuiltinPrecisionTests *)&local_2c8,
                   (FloatFormat *)
                   ((long)(local_250.out1.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_288),
                   (Vector<float,_2> *)pIVar23);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_440,(char *)local_538._0_8_,
                   CONCAT44(uStack_52c,local_538._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_440,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_440,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,2>>
                  (&local_4b0,(BuiltinPrecisionTests *)&local_2c8,(FloatFormat *)local_478,pIVar23);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_440,local_4b0._M_dataplus._M_p,local_4b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_440,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
          operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._0_8_ != &local_528) {
          operator_delete((void *)local_538._0_8_,local_528._M_allocated_capacity + 1);
        }
        if ((IVal *)local_508._0_8_ != (IVal *)auStack_4f8) {
          operator_delete((void *)local_508._0_8_,
                          (ulong)((long)(_Rb_tree_color *)auStack_4f8._0_8_ + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_440);
        std::ios_base::~ios_base(local_3d0);
      }
      local_510 = local_510 + 1;
    } while (local_510 != local_2a0);
    iVar15 = SUB84(local_490,0);
    if (iVar15 < 0x65) {
      if (iVar15 == 0) goto LAB_017883d2;
    }
    else {
      local_448 = (undefined1  [8])((pPVar28->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_440);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_440,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)auStack_440,iVar15 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_440," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_440);
      std::ios_base::~ios_base(local_3d0);
      pPVar28 = local_540;
    }
    local_448 = (undefined1  [8])((pPVar28->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_440);
    std::ostream::operator<<((ostringstream *)auStack_440,iVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_440,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_440);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_440," inputs failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_440);
  std::ios_base::~ios_base(local_3d0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_250.out1.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out1.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_250.out0.
      super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}